

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall
TPZAnalysis::DefineGraphMesh
          (TPZAnalysis *this,int dim,set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *tensnames,string *plotfile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pTVar5;
  int64_t iVar6;
  ostream *poVar7;
  TPZGraphEl **ppTVar8;
  int iVar9;
  int in_ESI;
  TPZV3DGraphMesh *in_RDI;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_R9;
  string *in_stack_00000008;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000018;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000020;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_00000028;
  int in_stack_00000034;
  TPZCompMesh *in_stack_00000038;
  int posvtk;
  int pospos;
  int posdx;
  int64_t filelength;
  int posplot;
  int dim1;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff80;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  TPZCompMesh *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb4;
  
  iVar9 = in_ESI + -1;
  if (((in_RDI->super_TPZGraphMesh).fGeoMesh == (TPZGeoMesh *)0x0) ||
     (sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1c355e4), sVar4 == 0))
  {
    std::operator<<((ostream *)&std::cout,"TPZAnalysis::DefineGraphMesh nothing to post-process\n");
  }
  else {
    if (((in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
         fExtAlloc[(long)iVar9 + -0xc] != (TPZGraphEl **)0x0) &&
       (in_stack_ffffffffffffff98 =
             (TPZCompMesh *)
             (in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
             fExtAlloc[(long)iVar9 + -0xc], in_stack_ffffffffffffff98 != (TPZCompMesh *)0x0)) {
      (**(code **)(*(long *)in_stack_ffffffffffffff98 + 8))();
    }
    TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    iVar1 = std::__cxx11::string::rfind((char *)in_stack_00000008,0x20bf881);
    pTVar5 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::__cxx11::string::size();
    if ((long)pTVar5 - (long)iVar1 == 3) {
      iVar6 = TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(in_R9);
      if (iVar6 != 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "Tensors are not beint post-process for file = ");
        poVar7 = std::operator<<(poVar7,in_stack_00000008);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      ppTVar8 = (TPZGraphEl **)operator_new(0x538);
      TPZV3DGraphMesh::TPZV3DGraphMesh
                (in_RDI,in_stack_ffffffffffffff98,(int)((ulong)ppTVar8 >> 0x20),
                 (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      (in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
      fExtAlloc[(long)iVar9 + -0xc] = ppTVar8;
    }
    else {
      iVar1 = std::__cxx11::string::rfind((char *)in_stack_00000008,0x20c130e);
      if ((long)pTVar5 - (long)iVar1 == 3) {
        iVar6 = TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size(in_R9);
        if (iVar6 != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "Tensors are not beint post-process for file = ");
          poVar7 = std::operator<<(poVar7,in_stack_00000008);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        ppTVar8 = (TPZGraphEl **)operator_new(0x6e0);
        TPZDXGraphMesh::TPZDXGraphMesh
                  (_posvtk,in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000020,
                   in_stack_00000018);
        (in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
        fExtAlloc[(long)iVar9 + -0xc] = ppTVar8;
      }
      else {
        iVar2 = std::__cxx11::string::rfind((char *)in_stack_00000008,0x20bf8b5);
        if ((long)pTVar5 - (long)iVar2 == 3) {
          iVar6 = TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size(in_R9);
          iVar1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
          if (iVar6 != 0) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "Tensors are not beint post-process for file = ");
            poVar7 = std::operator<<(poVar7,in_stack_00000008);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          pTVar5 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x510);
          TPZMVGraphMesh::TPZMVGraphMesh
                    ((TPZMVGraphMesh *)in_RDI,in_stack_ffffffffffffff98,iVar1,
                     (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff88,
                     pTVar5,in_stack_ffffffffffffff78);
          (in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
          fExtAlloc[(long)iVar9 + -0xc] = (TPZGraphEl **)pTVar5;
        }
        else {
          iVar3 = std::__cxx11::string::rfind((char *)in_stack_00000008,0x209a499);
          if ((long)pTVar5 - (long)iVar3 == 4) {
            ppTVar8 = (TPZGraphEl **)operator_new(0x510);
            TPZVTKGraphMesh::TPZVTKGraphMesh
                      ((TPZVTKGraphMesh *)CONCAT44(in_stack_ffffffffffffffb4,iVar1),
                       (TPZCompMesh *)CONCAT44(iVar2,iVar3),(int)((ulong)in_RDI >> 0x20),
                       (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,pTVar5);
            (in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
            fExtAlloc[(long)iVar9 + -0xc] = ppTVar8;
          }
          else {
            std::operator<<((ostream *)&std::cout,"grafgrid was not created\n");
            (in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
            fExtAlloc[(long)iVar9 + -0xc] = (TPZGraphEl **)0x0;
          }
        }
      }
    }
    if ((in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.fVec.
        fExtAlloc[(long)iVar9 + -0xc] != (TPZGraphEl **)0x0) {
      ppTVar8 = (in_RDI->super_TPZGraphMesh).fElementList.super_TPZChunkVector<TPZGraphEl_*,_10>.
                fVec.fExtAlloc[(long)iVar9 + -0xc];
      (*(code *)*(TPZGraphMesh **)((long)(*ppTVar8 + 3) + 0x10))(ppTVar8,in_stack_00000008);
    }
  }
  return;
}

Assistant:

void TPZAnalysis::DefineGraphMesh(int dim, const std::set<int> & matids , const TPZVec<std::string> &scalnames, const TPZVec<std::string> &vecnames, const TPZVec<std::string> &tensnames, const std::string &plotfile) {

    int dim1 = dim - 1;
    if (!fCompMesh || matids.size() == 0) {
        cout << "TPZAnalysis::DefineGraphMesh nothing to post-process\n";
        return;
    }

    if (fGraphMesh[dim1]) delete fGraphMesh[dim1];
    fScalarNames[dim1] = scalnames;
    fVectorNames[dim1] = vecnames;
    int posplot = plotfile.rfind(".plt");
    int64_t filelength = plotfile.size();
    if (filelength - posplot == 3) {
        if(tensnames.size() != 0)
        {
            std::cout << "Tensors are not beint post-process for file = " << plotfile << std::endl;
        }
        fGraphMesh[dim1] = new TPZV3DGraphMesh(fCompMesh, dim, matids, scalnames, vecnames);
    } else {
        int posdx = plotfile.rfind(".dx");
        if (filelength - posdx == 3) {
            if(tensnames.size() != 0) {
                std::cout << "Tensors are not beint post-process for file = " << plotfile << std::endl;
                
            }
            fGraphMesh[dim1] = new TPZDXGraphMesh(fCompMesh, dim, matids, scalnames, vecnames);
        } else {
            int pospos = plotfile.rfind(".pos");
            if (filelength - pospos == 3) {
                if(tensnames.size() != 0) {
                    std::cout << "Tensors are not beint post-process for file = " << plotfile << std::endl;
                }
                fGraphMesh[dim1] = new TPZMVGraphMesh(fCompMesh, dim, matids, scalnames, vecnames);
            } else {
                int posvtk = plotfile.rfind(".vtk");
                if (filelength - posvtk == 4) {
                    fGraphMesh[dim1] = new TPZVTKGraphMesh(fCompMesh, dim, matids, scalnames, vecnames, tensnames);
                } else {
                    cout << "grafgrid was not created\n";
                    fGraphMesh[dim1] = 0;
                }
            }
        }
    }
    if (fGraphMesh[dim1]) {
        fGraphMesh[dim1]->SetFileName(plotfile);
    }
}